

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O1

void __thiscall
slang::ast::RandCaseStatement::serializeTo(RandCaseStatement *this,ASTSerializer *serializer)

{
  size_t sVar1;
  pointer pIVar2;
  Item *item;
  pointer pIVar3;
  string_view name;
  
  name._M_str = "items";
  name._M_len = 5;
  ASTSerializer::startArray(serializer,name);
  sVar1 = (this->items)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    pIVar3 = (this->items)._M_ptr;
    pIVar2 = pIVar3 + sVar1;
    do {
      ASTSerializer::startObject(serializer);
      ASTSerializer::write(serializer,4,"expr",(size_t)(pIVar3->expr).ptr);
      ASTSerializer::write(serializer,4,"stmt",(size_t)(pIVar3->stmt).ptr);
      ASTSerializer::endObject(serializer);
      pIVar3 = pIVar3 + 1;
    } while (pIVar3 != pIVar2);
  }
  ASTSerializer::endArray(serializer);
  return;
}

Assistant:

void RandCaseStatement::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("items");
    for (auto& item : items) {
        serializer.startObject();
        serializer.write("expr", *item.expr);
        serializer.write("stmt", *item.stmt);
        serializer.endObject();
    }
    serializer.endArray();
}